

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

int __thiscall
cmCTest::RunTest(cmCTest *this,vector<const_char_*,_std::allocator<const_char_*>_> *argv,
                string *output,int *retVal,ostream *log,double testTimeOut,
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *environment)

{
  pointer ppcVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  string *psVar6;
  cmsysProcess *cp;
  SaveRestoreEnvironment *pSVar7;
  undefined1 collapse;
  undefined1 extraout_DL;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar8;
  uint uVar9;
  ulong uVar10;
  char *__s1;
  bool bVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double local_908;
  vector<char,_std::allocator<char>_> tempOutput;
  int length;
  pointer pbStack_8c0;
  pointer local_8b8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_8b0;
  string *local_8a8;
  char *data;
  ostringstream oss;
  ostringstream msg;
  ostringstream cmCTestLog_msg;
  string local_588 [1120];
  double local_128;
  ostringstream *local_b0;
  ostringstream *local_a8;
  
  if (environment ==
      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    bVar11 = false;
  }
  else {
    bVar11 = (environment->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start !=
             (environment->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  }
  dVar12 = GetRemainingTimeAllowed(this);
  dVar12 = dVar12 + -120.0;
  dVar13 = this->TimeOut;
  dVar14 = dVar13;
  if (dVar12 <= dVar13) {
    dVar14 = dVar12;
  }
  local_908 = (double)(~-(ulong)(0.0 < dVar13) & (ulong)dVar12 |
                      (ulong)dVar14 & -(ulong)(0.0 < dVar13));
  if ((0.0 < testTimeOut) && (dVar13 = GetRemainingTimeAllowed(this), testTimeOut < dVar13)) {
    local_908 = testTimeOut;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  std::operator<<((ostream *)&cmCTestLog_msg,"Test timeout computed to be: ");
  dVar13 = (double)(~-(ulong)(0.0 < local_908) & 0x3ff0000000000000 |
                   (ulong)local_908 & -(ulong)(0.0 < local_908));
  poVar5 = std::ostream::_M_insert<double>(dVar13);
  std::operator<<(poVar5,"\n");
  std::__cxx11::stringbuf::str();
  Log(this,4,
      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
      ,0x52a,_oss,false);
  std::__cxx11::string::~string((string *)&oss);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  std::__cxx11::string::string
            ((string *)&cmCTestLog_msg,
             *(argv->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
              super__Vector_impl_data._M_start,(allocator *)&oss);
  psVar6 = cmSystemTools::GetCTestCommand_abi_cxx11_();
  bVar2 = cmsys::SystemTools::SameFile((string *)&cmCTestLog_msg,psVar6);
  if (bVar2) {
    bVar2 = this->ForceNewCTestProcess;
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
    if (bVar2 == false) {
      cmCTest((cmCTest *)&cmCTestLog_msg);
      std::__cxx11::string::_M_assign(local_588);
      local_8b0 = environment;
      local_8a8 = output;
      local_128 = dVar13;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
      local_8b8 = (pointer)0x0;
      _length = (pointer)0x0;
      pbStack_8c0 = (pointer)0x0;
      uVar9 = 0;
      uVar8 = extraout_RDX;
      local_b0 = (ostringstream *)&oss;
      local_a8 = (ostringstream *)&oss;
      while( true ) {
        collapse = (undefined1)uVar8;
        uVar10 = (ulong)uVar9;
        ppcVar1 = (argv->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if ((ulong)((long)(argv->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar1 >> 3) <= uVar10)
        break;
        __s1 = ppcVar1[uVar10];
        if (__s1 != (char *)0x0) {
          iVar3 = strcmp(__s1,"--build-generator");
          if ((0.0 < dVar13) && (iVar3 == 0)) {
            std::__cxx11::string::string((string *)&msg,"--test-timeout",(allocator *)&tempOutput);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&length,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&msg);
            std::__cxx11::string::~string((string *)&msg);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
            std::ostream::_M_insert<double>(dVar13);
            std::__cxx11::stringbuf::str();
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&length,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &tempOutput);
            std::__cxx11::string::~string((string *)&tempOutput);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
            __s1 = (argv->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar10];
          }
          std::__cxx11::string::string((string *)&msg,__s1,(allocator *)&tempOutput);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&length,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&msg);
          std::__cxx11::string::~string((string *)&msg);
          uVar8 = extraout_RDX_00;
        }
        uVar9 = uVar9 + 1;
      }
      if (log != (ostream *)0x0) {
        poVar5 = std::operator<<(log,"* Run internal CTest");
        std::endl<char,std::char_traits<char>>(poVar5);
        collapse = extraout_DL;
      }
      cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
                ((string *)&tempOutput,(SystemTools *)0x1,(bool)collapse);
      psVar6 = local_8a8;
      if (bVar11) {
        pSVar7 = (SaveRestoreEnvironment *)operator_new(0x20);
        cmSystemTools::SaveRestoreEnvironment::SaveRestoreEnvironment(pSVar7);
        cmSystemTools::AppendEnv(local_8b0);
      }
      else {
        pSVar7 = (SaveRestoreEnvironment *)0x0;
      }
      iVar3 = Run((cmCTest *)&cmCTestLog_msg,
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&length,psVar6);
      *retVal = iVar3;
      if (psVar6 != (string *)0x0) {
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::append((string *)psVar6);
        std::__cxx11::string::~string((string *)&msg);
        if (log != (ostream *)0x0) {
          std::operator<<(log,(string *)psVar6);
        }
      }
      cmsys::SystemTools::ChangeDirectory((string *)&tempOutput);
      if (psVar6 != (string *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
        poVar5 = std::operator<<((ostream *)&msg,"Internal cmCTest object used to run test.");
        poVar5 = std::endl<char,std::char_traits<char>>(poVar5);
        poVar5 = std::operator<<(poVar5,(string *)psVar6);
        std::endl<char,std::char_traits<char>>(poVar5);
        std::__cxx11::stringbuf::str();
        Log(this,4,
            "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
            ,0x564,data,false);
        std::__cxx11::string::~string((string *)&data);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&msg);
      }
      if (pSVar7 != (SaveRestoreEnvironment *)0x0) {
        (*pSVar7->_vptr_SaveRestoreEnvironment[1])(pSVar7);
      }
      std::__cxx11::string::~string((string *)&tempOutput);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&length);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
      ~cmCTest((cmCTest *)&cmCTestLog_msg);
      return 4;
    }
  }
  else {
    std::__cxx11::string::~string((string *)&cmCTestLog_msg);
  }
  tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (output != (string *)0x0) {
    std::__cxx11::string::assign((char *)output);
  }
  if (bVar11) {
    pSVar7 = (SaveRestoreEnvironment *)operator_new(0x20);
    cmSystemTools::SaveRestoreEnvironment::SaveRestoreEnvironment(pSVar7);
    cmSystemTools::AppendEnv(environment);
  }
  else {
    pSVar7 = (SaveRestoreEnvironment *)0x0;
  }
  cp = cmsysProcess_New();
  cmsysProcess_SetCommand
            (cp,(argv->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
                super__Vector_impl_data._M_start);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar5 = std::operator<<((ostream *)&cmCTestLog_msg,"Command is: ");
  poVar5 = std::operator<<(poVar5,*(argv->
                                   super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                                   _M_impl.super__Vector_impl_data._M_start);
  std::endl<char,std::char_traits<char>>(poVar5);
  std::__cxx11::stringbuf::str();
  Log(this,0,
      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
      ,0x578,_oss,false);
  std::__cxx11::string::~string((string *)&oss);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  if (cmSystemTools::s_RunCommandHideConsole == true) {
    cmsysProcess_SetOption(cp,0,1);
  }
  cmsysProcess_SetTimeout(cp,dVar13);
  cmsysProcess_Execute(cp);
  while (iVar3 = cmsysProcess_WaitForData(cp,&data,&length,(double *)0x0), iVar3 != 0) {
    if (output != (string *)0x0) {
      std::vector<char,std::allocator<char>>::insert<char*,void>
                ((vector<char,std::allocator<char>> *)&tempOutput,
                 (const_iterator)
                 tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish,data,data + length);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    _oss = data;
    operator<<((ostream *)&cmCTestLog_msg,(cmCTestLogWrite *)&oss);
    std::__cxx11::stringbuf::str();
    Log(this,4,
        "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
        ,0x589,_oss,false);
    std::__cxx11::string::~string((string *)&oss);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
    if (log != (ostream *)0x0) {
      std::ostream::write((char *)log,(long)data);
    }
  }
  cmsysProcess_WaitForExit(cp,(double *)0x0);
  if ((output != (string *)0x0) &&
     (tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish)) {
    std::__cxx11::string::append
              ((char *)output,
               (ulong)tempOutput.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
  poVar5 = std::operator<<((ostream *)&cmCTestLog_msg,"-- Process completed");
  std::endl<char,std::char_traits<char>>(poVar5);
  std::__cxx11::stringbuf::str();
  Log(this,4,
      "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
      ,0x596,_oss,false);
  std::__cxx11::string::~string((string *)&oss);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  iVar3 = cmsysProcess_GetState(cp);
  if (iVar3 == 1) {
    std::__cxx11::string::string
              ((string *)&oss,"\n*** ERROR executing: ",(allocator *)&cmCTestLog_msg);
    cmsysProcess_GetErrorString(cp);
    std::__cxx11::string::append((char *)&oss);
    if (output != (string *)0x0) {
      std::__cxx11::string::append((string *)output);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar5 = std::operator<<((ostream *)&cmCTestLog_msg,_oss);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(this,4,
        "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
        ,0x5bb,_msg,false);
  }
  else {
    if (iVar3 != 2) {
      if (iVar3 == 4) {
        iVar4 = cmsysProcess_GetExitValue(cp);
        *retVal = iVar4;
        if ((iVar4 != 0) && (this->OutputTestOutputOnTestFailure == true)) {
          OutputTestErrors(this,&tempOutput);
        }
      }
      goto LAB_002ada8b;
    }
    if (this->OutputTestOutputOnTestFailure == true) {
      OutputTestErrors(this,&tempOutput);
    }
    iVar4 = cmsysProcess_GetExitException(cp);
    *retVal = iVar4;
    std::__cxx11::string::string
              ((string *)&oss,"\n*** Exception executing: ",(allocator *)&cmCTestLog_msg);
    cmsysProcess_GetExceptionString(cp);
    std::__cxx11::string::append((char *)&oss);
    if (output != (string *)0x0) {
      std::__cxx11::string::append((string *)output);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
    poVar5 = std::operator<<((ostream *)&cmCTestLog_msg,_oss);
    std::endl<char,std::char_traits<char>>(poVar5);
    std::ostream::flush();
    std::__cxx11::stringbuf::str();
    Log(this,4,
        "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmCTest.cxx"
        ,0x5b0,_msg,false);
  }
  std::__cxx11::string::~string((string *)&msg);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
  std::__cxx11::string::~string((string *)&oss);
LAB_002ada8b:
  cmsysProcess_Delete(cp);
  if (pSVar7 != (SaveRestoreEnvironment *)0x0) {
    (*pSVar7->_vptr_SaveRestoreEnvironment[1])(pSVar7);
  }
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
            (&tempOutput.super__Vector_base<char,_std::allocator<char>_>);
  return iVar3;
}

Assistant:

int cmCTest::RunTest(std::vector<const char*> argv,
                     std::string* output, int *retVal,
                     std::ostream* log, double testTimeOut,
                     std::vector<std::string>* environment)
{
  bool modifyEnv = (environment && !environment->empty());

  // determine how much time we have
  double timeout = this->GetRemainingTimeAllowed() - 120;
  if (this->TimeOut > 0 && this->TimeOut < timeout)
    {
    timeout = this->TimeOut;
    }
  if (testTimeOut > 0
      && testTimeOut < this->GetRemainingTimeAllowed())
    {
    timeout = testTimeOut;
    }

  // always have at least 1 second if we got to here
  if (timeout <= 0)
    {
    timeout = 1;
    }
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
             "Test timeout computed to be: " << timeout << "\n");
  if(cmSystemTools::SameFile(
       argv[0], cmSystemTools::GetCTestCommand()) &&
     !this->ForceNewCTestProcess)
    {
    cmCTest inst;
    inst.ConfigType = this->ConfigType;
    inst.TimeOut = timeout;

    // Capture output of the child ctest.
    std::ostringstream oss;
    inst.SetStreams(&oss, &oss);

    std::vector<std::string> args;
    for(unsigned int i =0; i < argv.size(); ++i)
      {
      if(argv[i])
        {
        // make sure we pass the timeout in for any build and test
        // invocations. Since --build-generator is required this is a
        // good place to check for it, and to add the arguments in
        if (strcmp(argv[i],"--build-generator") == 0 && timeout > 0)
          {
          args.push_back("--test-timeout");
          std::ostringstream msg;
          msg << timeout;
          args.push_back(msg.str());
          }
        args.push_back(argv[i]);
        }
      }
    if ( log )
      {
      *log << "* Run internal CTest" << std::endl;
      }
    std::string oldpath = cmSystemTools::GetCurrentWorkingDirectory();

    cmsys::auto_ptr<cmSystemTools::SaveRestoreEnvironment> saveEnv;
    if (modifyEnv)
      {
      saveEnv.reset(new cmSystemTools::SaveRestoreEnvironment);
      cmSystemTools::AppendEnv(*environment);
      }

    *retVal = inst.Run(args, output);
    if(output)
      {
      *output += oss.str();
      }
    if ( log && output)
      {
      *log << *output;
      }
    cmSystemTools::ChangeDirectory(oldpath);
    if(output)
      {
      cmCTestLog(this, HANDLER_VERBOSE_OUTPUT,
                 "Internal cmCTest object used to run test." << std::endl
                 <<  *output << std::endl);
      }

    return cmsysProcess_State_Exited;
    }
  std::vector<char> tempOutput;
  if ( output )
    {
    *output = "";
    }

  cmsys::auto_ptr<cmSystemTools::SaveRestoreEnvironment> saveEnv;
  if (modifyEnv)
    {
    saveEnv.reset(new cmSystemTools::SaveRestoreEnvironment);
    cmSystemTools::AppendEnv(*environment);
    }

  cmsysProcess* cp = cmsysProcess_New();
  cmsysProcess_SetCommand(cp, &*argv.begin());
  cmCTestLog(this, DEBUG, "Command is: " << argv[0] << std::endl);
  if(cmSystemTools::GetRunCommandHideConsole())
    {
    cmsysProcess_SetOption(cp, cmsysProcess_Option_HideWindow, 1);
    }

  cmsysProcess_SetTimeout(cp, timeout);
  cmsysProcess_Execute(cp);

  char* data;
  int length;
  while(cmsysProcess_WaitForData(cp, &data, &length, 0))
    {
    if ( output )
      {
      tempOutput.insert(tempOutput.end(), data, data+length);
      }
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, cmCTestLogWrite(data, length));
    if ( log )
      {
      log->write(data, length);
      }
    }

  cmsysProcess_WaitForExit(cp, 0);
  if(output && tempOutput.begin() != tempOutput.end())
    {
    output->append(&*tempOutput.begin(), tempOutput.size());
    }
  cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, "-- Process completed"
    << std::endl);

  int result = cmsysProcess_GetState(cp);

  if(result == cmsysProcess_State_Exited)
    {
    *retVal = cmsysProcess_GetExitValue(cp);
    if(*retVal != 0 && this->OutputTestOutputOnTestFailure)
      {
        OutputTestErrors(tempOutput);
      }
    }
  else if(result == cmsysProcess_State_Exception)
    {
    if(this->OutputTestOutputOnTestFailure)
      {
        OutputTestErrors(tempOutput);
      }
    *retVal = cmsysProcess_GetExitException(cp);
    std::string outerr = "\n*** Exception executing: ";
    outerr += cmsysProcess_GetExceptionString(cp);
    if(output)
      {
      *output += outerr;
      }
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, outerr.c_str() << std::endl
      << std::flush);
    }
  else if(result == cmsysProcess_State_Error)
    {
    std::string outerr = "\n*** ERROR executing: ";
    outerr += cmsysProcess_GetErrorString(cp);
    if(output)
      {
      *output += outerr;
      }
    cmCTestLog(this, HANDLER_VERBOSE_OUTPUT, outerr.c_str() << std::endl
      << std::flush);
    }
  cmsysProcess_Delete(cp);

  return result;
}